

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void BasicTests::testRandomKeys(char *networkSourceFile)

{
  RK_Individual *this;
  Graph *pGVar1;
  int iVar2;
  Graph *pGVar3;
  Random_keys *this_00;
  reference ppRVar4;
  double dVar5;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> local_80;
  RK_Individual *local_68;
  RK_Individual *best;
  Random_keys *pRStack_58;
  int melhorGeracao;
  Random_keys *rd;
  string local_48 [48];
  Graph *local_18;
  Graph *g;
  char *networkSourceFile_local;
  
  g = (Graph *)networkSourceFile;
  pGVar3 = (Graph *)operator_new(0x88);
  Graph::Graph(pGVar3);
  local_18 = pGVar3;
  Graph::addChargeLevel(pGVar3,0.5,1000,0.06);
  Graph::addChargeLevel(local_18,1.0,0x1a68,0.06);
  Graph::addChargeLevel(local_18,1.8,1000,0.06);
  pGVar1 = g;
  pGVar3 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)pGVar1,(allocator *)((long)&rd + 7));
  Graph::input_read(pGVar3,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rd + 7));
  Graph::defineModifiables(local_18);
  Graph::resetEdgesMarking(local_18);
  Graph::markOneDirectionInEdges(local_18);
  RK_Individual::criaCromossomos(local_18);
  this_00 = (Random_keys *)operator_new(0x38);
  Random_keys::Random_keys(this_00,100,1000);
  pRStack_58 = this_00;
  Random_keys::geraPopAleatoria(this_00,local_18);
  best._4_4_ = Random_keys::avancaGeracoes(pRStack_58,local_18);
  Random_keys::getPopAtual(&local_80,pRStack_58);
  iVar2 = Random_keys::getTamPopulacao(pRStack_58);
  ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (&local_80,(long)(iVar2 + -1));
  this = *ppRVar4;
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::~vector(&local_80);
  local_68 = this;
  dVar5 = RK_Individual::getActiveLoss(this);
  printf("        %.3f  &  ",dVar5 * 100000.0);
  Graph::minVoltage(local_18);
  printf("        %.3f  &   ");
  printf("        %d    &   ",(ulong)best._4_4_);
  return;
}

Assistant:

void BasicTests::testRandomKeys(char *networkSourceFile) {
    Graph *g = new Graph();

    g->addChargeLevel(0.50, 1000, 0.06);
    g->addChargeLevel(1.00, 6760, 0.06);
    g->addChargeLevel(1.80, 1000, 0.06);

    g->input_read(networkSourceFile);
    g->defineModifiables();
    g->resetEdgesMarking();
    g->markOneDirectionInEdges();

    RK_Individual::criaCromossomos(g);

    Random_keys *rd = new Random_keys(100, 1000);

    rd->geraPopAleatoria(g);

//    rd->geraPopAleatoriaConfInicial(g, configuracaoInicial(networkSourceFile),
//                                    g->getEdgesSizes() / 2 - (g->getVerticesSize() - 1));

    int melhorGeracao = rd->avancaGeracoes(g);

    RK_Individual *best = rd->getPopAtual().at(rd->getTamPopulacao() - 1);

    printf("        %.3f  &  ", 100 * 1000 * best->getActiveLoss());
    printf("        %.3f  &   ", g->minVoltage());
    printf("        %d    &   ", melhorGeracao);
}